

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uintwide_t<512U,_unsigned_short,_void,_false> * __thiscall
math::wide_integer::uintwide_t<512U,_unsigned_short,_void,_false>::operator*=
          (uintwide_t<512U,_unsigned_short,_void,_false> *this,
          uintwide_t<512U,_unsigned_short,_void,_false> *other)

{
  undefined1 local_58 [8];
  uintwide_t<512U,_unsigned_short,_void,_false> other_as_self_copy;
  uintwide_t<512U,_unsigned_short,_void,_false> *other_local;
  uintwide_t<512U,_unsigned_short,_void,_false> *this_local;
  
  other_as_self_copy.values.super_array<unsigned_short,_32UL>.elems._56_8_ = other;
  if (this == other) {
    memcpy(local_58,other,0x40);
    void_math::wide_integer::uintwide_t<512u,unsigned_short,void,false>::eval_mul_unary<512u>(math::
    wide_integer::uintwide_t<512u,unsigned_short,void,false>&,math::wide_integer::
    uintwide_t<512u,unsigned_short,void,false>const&,std::enable_if<((512u)/std::
    numeric_limits<unsigned_short>::digits)<math::wide_integer::
    uintwide_t<512u,unsigned_short,void,false>::number_of_limbs_karatsuba_threshold,void>::type__
              (this,(uintwide_t<512U,_unsigned_short,_void,_false> *)local_58,
               (enable_if_t<((512U___std::numeric_limits<unsigned_short>::digits)_<_number_of_limbs_karatsuba_threshold)>
                *)0x0);
  }
  else {
    void_math::wide_integer::uintwide_t<512u,unsigned_short,void,false>::eval_mul_unary<512u>(math::
    wide_integer::uintwide_t<512u,unsigned_short,void,false>&,math::wide_integer::
    uintwide_t<512u,unsigned_short,void,false>const&,std::enable_if<((512u)/std::
    numeric_limits<unsigned_short>::digits)<math::wide_integer::
    uintwide_t<512u,unsigned_short,void,false>::number_of_limbs_karatsuba_threshold,void>::type__
              (this,other,
               (enable_if_t<((512U___std::numeric_limits<unsigned_short>::digits)_<_number_of_limbs_karatsuba_threshold)>
                *)0x0);
  }
  return this;
}

Assistant:

constexpr auto operator*=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        const uintwide_t other_as_self_copy(other); // NOLINT(performance-unnecessary-copy-initialization)

        eval_mul_unary(*this, other_as_self_copy);
      }
      else
      {
        eval_mul_unary(*this, other);
      }

      return *this;
    }